

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O1

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::TouchEvent,QWindow*,unsigned_long,QEvent::Type,QPointingDevice_const*,QList<QEventPoint>,QFlags<Qt::KeyboardModifier>>
               (QWindow *args,unsigned_long args_1,Type args_2,QPointingDevice *args_3,
               QList<QEventPoint> args_4,QFlags<Qt::KeyboardModifier> args_5)

{
  Data *pDVar1;
  long lVar2;
  long lVar3;
  QList<QEventPoint> args_4_00;
  QList<QEventPoint> args_4_01;
  bool bVar4;
  QArrayDataPointer<QEventPoint> *this;
  undefined4 in_register_00000084;
  long *plVar5;
  long in_FS_OFFSET;
  Data *in_stack_ffffffffffffffb8;
  QEventPoint *in_stack_ffffffffffffffc0;
  qsizetype in_stack_ffffffffffffffc8;
  QArrayDataPointer<QEventPoint> local_30;
  long local_18;
  
  plVar5 = (long *)CONCAT44(in_register_00000084,
                            args_5.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                            super_QFlagsStorage<Qt::KeyboardModifier>.i);
  this = (QArrayDataPointer<QEventPoint> *)&stack0xffffffffffffffb8;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (Data *)*plVar5;
  if (QWindowSystemInterfacePrivate::synchronousWindowSystemEvents) {
    local_30.ptr = (QEventPoint *)plVar5[1];
    local_30.size = plVar5[2];
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    this = &local_30;
    args_4_00.d.ptr = in_stack_ffffffffffffffc0;
    args_4_00.d.d = in_stack_ffffffffffffffb8;
    args_4_00.d.size = in_stack_ffffffffffffffc8;
    local_30.d = pDVar1;
    bVar4 = QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
            handleEvent<QWindowSystemInterfacePrivate::TouchEvent,QWindow*,unsigned_long,QEvent::Type,QPointingDevice_const*,QList<QEventPoint>,QFlags<Qt::KeyboardModifier>>
                      (args,args_1,args_2,args_3,args_4_00,
                       (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)SUB84(this,0));
  }
  else {
    lVar2 = plVar5[1];
    lVar3 = plVar5[2];
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    args_4_01.d.ptr = (QEventPoint *)lVar2;
    args_4_01.d.d = pDVar1;
    args_4_01.d.size = lVar3;
    bVar4 = QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
            handleEvent<QWindowSystemInterfacePrivate::TouchEvent,QWindow*,unsigned_long,QEvent::Type,QPointingDevice_const*,QList<QEventPoint>,QFlags<Qt::KeyboardModifier>>
                      (args,args_1,args_2,args_3,args_4_01,
                       (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
                       SUB84(&stack0xffffffffffffffb8,0));
  }
  QArrayDataPointer<QEventPoint>::~QArrayDataPointer(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::handleEvent(Args ...args)
{
    return QWindowSystemInterfacePrivate::synchronousWindowSystemEvents
        ? QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent<EventType>(args...)
        : QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
}